

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * vkt::shaderexecutor::call<vkt::shaderexecutor::Functions::Mul>
                 (IRet *__return_storage_ptr__,EvalContext *ctx,IArg0 *arg0,IArg1 *arg1,IArg2 *arg2,
                 IArg3 *arg3)

{
  Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this;
  IArg3 *arg3_local;
  IArg2 *arg2_local;
  IArg1 *arg1_local;
  IArg0 *arg0_local;
  EvalContext *ctx_local;
  
  this = (Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *)instance<vkt::shaderexecutor::Functions::Mul>();
  Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::apply(__return_storage_ptr__,this,ctx,arg0,arg1,arg2,arg3);
  return __return_storage_ptr__;
}

Assistant:

typename F::IRet call (const EvalContext&			ctx,
					   const typename F::IArg0&		arg0 = Void(),
					   const typename F::IArg1&		arg1 = Void(),
					   const typename F::IArg2&		arg2 = Void(),
					   const typename F::IArg3&		arg3 = Void())
{
	return instance<F>().apply(ctx, arg0, arg1, arg2, arg3);
}